

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus AddThumbPredicate(cs_struct *ud,MCInst *MI)

{
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  DecodeStatus extraout_EAX;
  MCOperand *pMVar5;
  byte bVar6;
  ulong uVar7;
  MCOperandInfo *m;
  ulong Val;
  
  uVar3 = MCInst_getOpcode(MI);
  if ((int)uVar3 < 0xa51) {
    if ((uVar3 - 0x90f < 3) || ((uVar3 != 0x8fc && (uVar3 == 0x904)))) goto LAB_0014829f;
LAB_001482ce:
    uVar3 = (ud->ITBlock).size;
    if (uVar3 == 0) {
      Val = 0xe;
      goto LAB_001482f7;
    }
  }
  else {
    if ((0x34 < uVar3 - 0xa98) || ((0x1000100000010dU >> ((ulong)(uVar3 - 0xa98) & 0x3f) & 1) == 0))
    goto LAB_001482ce;
LAB_0014829f:
    uVar3 = (ud->ITBlock).size;
    if (uVar3 == 0) {
      return MCDisassembler_Fail;
    }
  }
  bVar1 = (ud->ITBlock).ITStates[uVar3 - 1];
  bVar6 = 0xe;
  if (bVar1 != 0xf) {
    bVar6 = bVar1;
  }
  Val = (ulong)bVar6;
  (ud->ITBlock).size = uVar3 - 1;
LAB_001482f7:
  uVar3 = MCInst_getOpcode(MI);
  m = ARMInsts[uVar3].OpInfo;
  uVar3 = MCInst_getOpcode(MI);
  bVar1 = ARMInsts[uVar3].NumOperands;
  uVar3 = (uint)bVar1;
  if (bVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar7 = 0;
    do {
      uVar4 = MCInst_getNumOperands(MI);
      if ((uVar7 == uVar4) || (_Var2 = MCOperandInfo_isPredicate(m), _Var2)) {
        uVar3 = (uint)uVar7;
        break;
      }
      uVar7 = uVar7 + 1;
      m = m + 1;
    } while (bVar1 != uVar7);
  }
  pMVar5 = MCOperand_CreateImm1(MI,Val);
  MCInst_insert0(MI,uVar3,pMVar5);
  pMVar5 = MCOperand_CreateReg1(MI,(uint)((int)Val != 0xe) * 3);
  MCInst_insert0(MI,uVar3 + 1,pMVar5);
  return extraout_EAX;
}

Assistant:

static DecodeStatus AddThumbPredicate(cs_struct *ud, MCInst *MI)
{
	DecodeStatus S = MCDisassembler_Success;
	MCOperandInfo *OpInfo;
	unsigned short NumOps;
	unsigned int i;
	unsigned CC;

	// A few instructions actually have predicates encoded in them.  Don't
	// try to overwrite it if we're seeing one of those.
	switch (MCInst_getOpcode(MI)) {
		case ARM_tBcc:
		case ARM_t2Bcc:
		case ARM_tCBZ:
		case ARM_tCBNZ:
		case ARM_tCPS:
		case ARM_t2CPS3p:
		case ARM_t2CPS2p:
		case ARM_t2CPS1p:
		case ARM_tMOVSr:
		case ARM_tSETEND:
			// Some instructions (mostly conditional branches) are not
			// allowed in IT blocks.
			if (ITStatus_instrInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			else
				return MCDisassembler_Success;
			break;
		case ARM_tB:
		case ARM_t2B:
		case ARM_t2TBB:
		case ARM_t2TBH:
			// Some instructions (mostly unconditional branches) can
			// only appears at the end of, or outside of, an IT.
			//if (ITBlock.instrInITBlock() && !ITBlock.instrLastInITBlock())
			if (ITStatus_instrInITBlock(&(ud->ITBlock)) && !ITStatus_instrLastInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}

	// If we're in an IT block, base the predicate on that.  Otherwise,
	// assume a predicate of AL.
	CC = ITStatus_getITCC(&(ud->ITBlock));
	if (CC == 0xF) 
		CC = ARMCC_AL;
	if (ITStatus_instrInITBlock(&(ud->ITBlock)))
		ITStatus_advanceITState(&(ud->ITBlock));

	OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;

	for (i = 0; i < NumOps; ++i) {
		if (i == MCInst_getNumOperands(MI)) break;
		if (MCOperandInfo_isPredicate(&OpInfo[i])) {
			MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
			if (CC == ARMCC_AL)
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
			else
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));
			return S;
		}
	}

	MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
	if (CC == ARMCC_AL)
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
	else
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));

	return S;
}